

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O2

int64_t memory_tree_ns::pick_nearest(memory_tree *b,single_learner *base,uint32_t cn,example *ec)

{
  int iVar1;
  node *pnVar2;
  size_t sVar3;
  example *peVar4;
  uint *puVar5;
  uint *puVar6;
  size_t i;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  
  pnVar2 = (b->nodes)._begin;
  puVar6 = pnVar2[cn].examples_index._begin;
  puVar5 = pnVar2[cn].examples_index._end;
  if (puVar5 == puVar6) {
    uVar8 = 0xffffffffffffffff;
  }
  else {
    uVar8 = 0xffffffffffffffff;
    fVar10 = -3.4028235e+38;
    for (uVar7 = 0; uVar7 < (ulong)((long)puVar5 - (long)puVar6 >> 2); uVar7 = uVar7 + 1) {
      uVar9 = (ulong)puVar6[uVar7];
      iVar1 = b->learn_at_leaf;
      sVar3 = b->current_pass;
      fVar11 = normalized_linear_prod(b,ec,(b->examples)._begin[uVar9]);
      if ((iVar1 == 1) && (sVar3 != 0)) {
        diag_kronecker_product_test(ec,(b->examples)._begin[uVar9],b->kprod_ec,b->oas);
        peVar4 = b->kprod_ec;
        (peVar4->l).cs.costs._begin = (wclass *)0x7f7fffff;
        (peVar4->l).simple.initial = fVar11;
        LEARNER::learner<char,_example>::predict(base,b->kprod_ec,b->max_routers);
        fVar11 = b->kprod_ec->partial_prediction;
      }
      if (fVar11 <= fVar10) {
        fVar11 = fVar10;
        uVar9 = uVar8;
      }
      uVar8 = uVar9;
      pnVar2 = (b->nodes)._begin;
      puVar6 = pnVar2[cn].examples_index._begin;
      puVar5 = pnVar2[cn].examples_index._end;
      fVar10 = fVar11;
    }
  }
  return uVar8;
}

Assistant:

int64_t pick_nearest(memory_tree& b, single_learner& base, const uint32_t cn, example& ec)
    {
        if (b.nodes[cn].examples_index.size() > 0)
        {
            float max_score = -FLT_MAX;
            int64_t max_pos = -1;
            for(size_t i = 0; i < b.nodes[cn].examples_index.size(); i++)
            {
                float score = 0.f;
                uint32_t loc = b.nodes[cn].examples_index[i];

                //do not use reward to update memory tree during the very first pass 
                //(which is for unsupervised training for memory tree)
                if (b.learn_at_leaf == true && b.current_pass >= 1){ 
                    float tmp_s = normalized_linear_prod(b, &ec, b.examples[loc]);
                    diag_kronecker_product_test(ec, *b.examples[loc], *b.kprod_ec, b.oas );
                    b.kprod_ec->l.simple = {FLT_MAX, 0., tmp_s};
                    base.predict(*b.kprod_ec, b.max_routers);
                    score = b.kprod_ec->partial_prediction;
                }
                else
                    score = normalized_linear_prod(b, &ec, b.examples[loc]);
                
                if (score > max_score){
                    max_score = score;
                    max_pos = (int64_t)loc;
                }
            }
            return max_pos;
        }
        else
            return -1;
    }